

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O0

uint32_t crc32_8bytes(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *local_38;
  uint8_t *currentChar;
  uint32_t two;
  uint32_t one;
  uint32_t *current;
  uint32_t crc;
  uint32_t previousCrc32_local;
  size_t length_local;
  void *data_local;
  
  current._0_4_ = previousCrc32 ^ 0xffffffff;
  _two = (uint *)data;
  for (_crc = length; 7 < _crc; _crc = _crc - 8) {
    puVar3 = _two + 1;
    uVar2 = *_two ^ (uint)current;
    _two = _two + 2;
    uVar1 = *puVar3;
    current._0_4_ =
         Crc32Lookup[0][uVar1 >> 0x18] ^ Crc32Lookup[1][uVar1 >> 0x10 & 0xff] ^
         Crc32Lookup[2][uVar1 >> 8 & 0xff] ^ Crc32Lookup[3][uVar1 & 0xff] ^
         Crc32Lookup[4][uVar2 >> 0x18] ^ Crc32Lookup[5][uVar2 >> 0x10 & 0xff] ^
         Crc32Lookup[6][uVar2 >> 8 & 0xff] ^ Crc32Lookup[7][uVar2 & 0xff];
  }
  local_38 = _two;
  while (_crc != 0) {
    current._0_4_ =
         (uint)current >> 8 ^ Crc32Lookup[0][(uint)current & 0xff ^ (uint)(byte)*local_38];
    local_38 = (uint *)((long)local_38 + 1);
    _crc = _crc - 1;
  }
  return (uint)current ^ 0xffffffff;
}

Assistant:

uint32_t crc32_8bytes(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // process eight bytes at once (Slicing-by-8)
  while (length >= 8)
  {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one = *current++ ^ swap(crc);
    uint32_t two = *current++;
    crc = Crc32Lookup[0][ two      & 0xFF] ^
          Crc32Lookup[1][(two>> 8) & 0xFF] ^
          Crc32Lookup[2][(two>>16) & 0xFF] ^
          Crc32Lookup[3][(two>>24) & 0xFF] ^
          Crc32Lookup[4][ one      & 0xFF] ^
          Crc32Lookup[5][(one>> 8) & 0xFF] ^
          Crc32Lookup[6][(one>>16) & 0xFF] ^
          Crc32Lookup[7][(one>>24) & 0xFF];
#else
    uint32_t one = *current++ ^ crc;
    uint32_t two = *current++;
    crc = Crc32Lookup[0][(two>>24) & 0xFF] ^
          Crc32Lookup[1][(two>>16) & 0xFF] ^
          Crc32Lookup[2][(two>> 8) & 0xFF] ^
          Crc32Lookup[3][ two      & 0xFF] ^
          Crc32Lookup[4][(one>>24) & 0xFF] ^
          Crc32Lookup[5][(one>>16) & 0xFF] ^
          Crc32Lookup[6][(one>> 8) & 0xFF] ^
          Crc32Lookup[7][ one      & 0xFF];
#endif

    length -= 8;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 7 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}